

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O1

void deqp::gls::FboUtil::config::glInitFlat(TextureFlat *cfg,GLenum target,Functions *gl)

{
  TransferFormat TVar1;
  int iVar2;
  int iVar3;
  GLsizei GVar4;
  
  TVar1 = transferImageFormat(&(cfg->super_Texture).super_Image.internalFormat);
  if (0 < (cfg->super_Texture).numLevels) {
    iVar2 = (cfg->super_Texture).super_Image.width;
    GVar4 = (cfg->super_Texture).super_Image.height;
    iVar3 = 0;
    do {
      (*gl->texImage2D)(target,iVar3,(cfg->super_Texture).super_Image.internalFormat.format,iVar2,
                        GVar4,0,TVar1.format,TVar1.dataType,(void *)0x0);
      iVar2 = iVar2 / 2;
      if (iVar2 < 2) {
        iVar2 = 1;
      }
      GVar4 = GVar4 / 2;
      if (GVar4 < 2) {
        GVar4 = 1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < (cfg->super_Texture).numLevels);
  }
  return;
}

Assistant:

static void glInitFlat (const TextureFlat& cfg, GLenum target, const glw::Functions& gl)
{
	const TransferFormat format = transferImageFormat(cfg.internalFormat);
	GLint w = cfg.width;
	GLint h = cfg.height;
	for (GLint level = 0; level < cfg.numLevels; level++)
	{
		gl.texImage2D(target, level, cfg.internalFormat.format, w, h, 0,
					  format.format, format.dataType, DE_NULL);
		w = de::max(1, w / 2);
		h = de::max(1, h / 2);
	}
}